

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
AsyncRgbLedAnalyzerSettings::LoadSettings(AsyncRgbLedAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  U32 controllerInt;
  SimpleArchive aSStack_28 [12];
  Controller local_1c;
  
  SimpleArchive::SimpleArchive(aSStack_28);
  SimpleArchive::SetString((char *)aSStack_28);
  SimpleArchive::operator>>(aSStack_28,&this->mInputChannel);
  SimpleArchive::operator>>(aSStack_28,&local_1c);
  this->mLEDController = local_1c;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel
            ((Channel *)this,(char *)&this->mInputChannel,SUB81(DEFAULT_CHANNEL_NAME,0));
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (this->mInputChannelInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mLEDController);
  SimpleArchive::~SimpleArchive(aSStack_28);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    U32 controllerInt;
    text_archive >> mInputChannel;
    text_archive >> controllerInt;
    mLEDController = static_cast<Controller>( controllerInt );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, true );

    UpdateInterfacesFromSettings();
}